

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_ussub64_mips64(void *d,void *a,void *b,uint32_t desc)

{
  intptr_t oprsz_00;
  undefined8 local_50;
  uint64_t di;
  uint64_t bi;
  uint64_t ai;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *b_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (ai = 0; (long)ai < oprsz_00; ai = ai + 8) {
    local_50 = *(ulong *)((long)a + ai) - *(ulong *)((long)b + ai);
    if (*(ulong *)((long)a + ai) < *(ulong *)((long)b + ai)) {
      local_50 = 0;
    }
    *(long *)((long)d + ai) = local_50;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_ussub64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        uint64_t ai = *(uint64_t *)((char *)a + i);
        uint64_t bi = *(uint64_t *)((char *)b + i);
        uint64_t di = ai - bi;
        if (ai < bi) {
            di = 0;
        }
        *(uint64_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}